

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::ApprovalTestNamer::getApprovalsSubdirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  long *plVar1;
  long *plVar2;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  testConfiguration();
  if (testConfiguration::configuration.subdirectory._M_string_length != 0) {
    testConfiguration();
    SystemUtils::getDirectorySeparator_abi_cxx11_();
    plVar1 = (long *)::std::__cxx11::string::replace
                               ((ulong)local_58,0,(char *)0x0,
                                (ulong)testConfiguration::configuration.subdirectory._M_dataplus.
                                       _M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_28 = *plVar2;
      lStack_20 = plVar1[3];
      local_38 = &local_28;
    }
    else {
      local_28 = *plVar2;
      local_38 = (long *)*plVar1;
    }
    local_30 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if (local_38 != &local_28) {
      operator_delete(local_38);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getApprovalsSubdirectory() const
    {
        std::string sub_directory;
        if (!testConfiguration().subdirectory.empty())
        {
            sub_directory =
                testConfiguration().subdirectory + SystemUtils::getDirectorySeparator();
        }
        return sub_directory;
    }